

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O3

uint64_t helper_neon_qsub_u64_aarch64(CPUARMState_conflict *env,uint64_t src1,uint64_t src2)

{
  uint64_t uVar1;
  
  uVar1 = src1 - src2;
  if (src1 < src2) {
    (env->vfp).qc[0] = 1;
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

uint64_t HELPER(neon_qsub_u64)(CPUARMState *env, uint64_t src1, uint64_t src2)
{
    uint64_t res;

    if (src1 < src2) {
        SET_QC();
        res = 0;
    } else {
        res = src1 - src2;
    }
    return res;
}